

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_service.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ServiceGenerator::GenerateBlockingStub
          (ServiceGenerator *this,Printer *printer)

{
  int iVar1;
  MethodDescriptor *method_00;
  mapped_type *pmVar2;
  Descriptor *this_00;
  int i_00;
  Descriptor *descriptor;
  allocator<char> local_101;
  key_type local_100;
  string local_e0;
  allocator<char> local_b9;
  key_type local_b8;
  string local_88;
  undefined1 local_68 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  MethodDescriptor *method_1;
  int i_1;
  MethodDescriptor *method;
  int i;
  Printer *printer_local;
  ServiceGenerator *this_local;
  
  io::Printer::Print(printer,
                     "public static BlockingInterface newBlockingStub(\n    com.google.protobuf.BlockingRpcChannel channel) {\n  return new BlockingStub(channel);\n}\n\n"
                    );
  io::Printer::Print(printer,"public interface BlockingInterface {");
  io::Printer::Indent(printer);
  method._4_4_ = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count(this->descriptor_);
    if (iVar1 <= method._4_4_) break;
    method_00 = ServiceDescriptor::method(this->descriptor_,method._4_4_);
    GenerateBlockingMethodSignature(this,printer,method_00);
    io::Printer::Print(printer,";\n");
    method._4_4_ = method._4_4_ + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  io::Printer::Print(printer,
                     "private static final class BlockingStub implements BlockingInterface {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "private BlockingStub(com.google.protobuf.BlockingRpcChannel channel) {\n  this.channel = channel;\n}\n\nprivate final com.google.protobuf.BlockingRpcChannel channel;\n"
                    );
  method_1._4_4_ = 0;
  while( true ) {
    iVar1 = ServiceDescriptor::method_count(this->descriptor_);
    if (iVar1 <= (int)method_1._4_4_) break;
    vars._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)ServiceDescriptor::method(this->descriptor_,method_1._4_4_);
    GenerateBlockingMethodSignature
              (this,printer,
               (MethodDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    io::Printer::Print(printer," {\n");
    io::Printer::Indent(printer);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_68);
    SimpleItoa_abi_cxx11_(&local_88,(protobuf *)(ulong)method_1._4_4_,i_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"index",&local_b9);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_68,&local_b8);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::__cxx11::string::~string((string *)&local_88);
    this_00 = MethodDescriptor::output_type
                        ((MethodDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ClassName_abi_cxx11_(&local_e0,(java *)this_00,descriptor);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"output",&local_101);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_68,&local_100);
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    std::__cxx11::string::~string((string *)&local_e0);
    io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_68,
                       "return ($output$) channel.callBlockingMethod(\n  getDescriptor().getMethods().get($index$),\n  controller,\n  request,\n  $output$.getDefaultInstance());\n"
                      );
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_68);
    method_1._4_4_ = method_1._4_4_ + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void ServiceGenerator::GenerateBlockingStub(io::Printer* printer) {
  printer->Print(
    "public static BlockingInterface newBlockingStub(\n"
    "    com.google.protobuf.BlockingRpcChannel channel) {\n"
    "  return new BlockingStub(channel);\n"
    "}\n"
    "\n");

  printer->Print(
    "public interface BlockingInterface {");
  printer->Indent();

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    GenerateBlockingMethodSignature(printer, method);
    printer->Print(";\n");
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  printer->Print(
    "private static final class BlockingStub implements BlockingInterface {\n");
  printer->Indent();

  printer->Print(
    "private BlockingStub(com.google.protobuf.BlockingRpcChannel channel) {\n"
    "  this.channel = channel;\n"
    "}\n"
    "\n"
    "private final com.google.protobuf.BlockingRpcChannel channel;\n");

  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    GenerateBlockingMethodSignature(printer, method);
    printer->Print(" {\n");
    printer->Indent();

    map<string, string> vars;
    vars["index"] = SimpleItoa(i);
    vars["output"] = ClassName(method->output_type());
    printer->Print(vars,
      "return ($output$) channel.callBlockingMethod(\n"
      "  getDescriptor().getMethods().get($index$),\n"
      "  controller,\n"
      "  request,\n"
      "  $output$.getDefaultInstance());\n");

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
}